

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O3

void __thiscall tinyxml2::XMLPrinter::XMLPrinter(XMLPrinter *this,FILE *file,bool compact,int depth)

{
  int *piVar1;
  long lVar2;
  
  (this->super_XMLVisitor)._vptr_XMLVisitor = (_func_int **)&PTR__XMLPrinter_001157a0;
  this->_elementJustOpened = false;
  (this->_stack)._mem = (this->_stack)._pool;
  (this->_stack)._allocated = 10;
  (this->_stack)._size = 0;
  this->_firstElement = true;
  this->_fp = file;
  this->_depth = depth;
  this->_textDepth = -1;
  this->_processEntities = true;
  this->_compactMode = compact;
  (this->_buffer)._mem = (this->_buffer)._pool;
  (this->_buffer)._allocated = 0x14;
  (this->_buffer)._size = 0;
  this->_entityFlag[0] = false;
  this->_entityFlag[1] = false;
  this->_entityFlag[2] = false;
  this->_entityFlag[3] = false;
  this->_entityFlag[4] = false;
  this->_entityFlag[5] = false;
  this->_entityFlag[6] = false;
  this->_entityFlag[7] = false;
  this->_entityFlag[8] = false;
  this->_entityFlag[9] = false;
  this->_entityFlag[10] = false;
  this->_entityFlag[0xb] = false;
  this->_entityFlag[0xc] = false;
  this->_entityFlag[0xd] = false;
  this->_entityFlag[0xe] = false;
  this->_entityFlag[0xf] = false;
  this->_entityFlag[0x10] = false;
  this->_entityFlag[0x11] = false;
  this->_entityFlag[0x12] = false;
  this->_entityFlag[0x13] = false;
  this->_entityFlag[0x14] = false;
  this->_entityFlag[0x15] = false;
  this->_entityFlag[0x16] = false;
  this->_entityFlag[0x17] = false;
  this->_entityFlag[0x18] = false;
  this->_entityFlag[0x19] = false;
  this->_entityFlag[0x1a] = false;
  this->_entityFlag[0x1b] = false;
  this->_entityFlag[0x1c] = false;
  this->_entityFlag[0x1d] = false;
  this->_entityFlag[0x1e] = false;
  this->_entityFlag[0x1f] = false;
  this->_entityFlag[0x20] = false;
  this->_entityFlag[0x21] = false;
  this->_entityFlag[0x22] = false;
  this->_entityFlag[0x23] = false;
  this->_entityFlag[0x24] = false;
  this->_entityFlag[0x25] = false;
  this->_entityFlag[0x26] = false;
  this->_entityFlag[0x27] = false;
  this->_entityFlag[0x28] = false;
  this->_entityFlag[0x29] = false;
  this->_entityFlag[0x2a] = false;
  this->_entityFlag[0x2b] = false;
  this->_entityFlag[0x2c] = false;
  this->_entityFlag[0x2d] = false;
  this->_entityFlag[0x2e] = false;
  this->_entityFlag[0x2f] = false;
  this->_entityFlag[0x30] = false;
  this->_entityFlag[0x31] = false;
  this->_entityFlag[0x32] = false;
  this->_entityFlag[0x33] = false;
  this->_entityFlag[0x34] = false;
  this->_entityFlag[0x35] = false;
  this->_entityFlag[0x36] = false;
  this->_entityFlag[0x37] = false;
  this->_entityFlag[0x38] = false;
  this->_entityFlag[0x39] = false;
  this->_entityFlag[0x3a] = false;
  this->_entityFlag[0x3b] = false;
  this->_entityFlag[0x3c] = false;
  this->_entityFlag[0x3d] = false;
  this->_entityFlag[0x3e] = false;
  this->_entityFlag[0x3f] = false;
  this->_restrictedEntityFlag[0] = false;
  this->_restrictedEntityFlag[1] = false;
  this->_restrictedEntityFlag[2] = false;
  this->_restrictedEntityFlag[3] = false;
  this->_restrictedEntityFlag[4] = false;
  this->_restrictedEntityFlag[5] = false;
  this->_restrictedEntityFlag[6] = false;
  this->_restrictedEntityFlag[7] = false;
  this->_restrictedEntityFlag[8] = false;
  this->_restrictedEntityFlag[9] = false;
  this->_restrictedEntityFlag[10] = false;
  this->_restrictedEntityFlag[0xb] = false;
  this->_restrictedEntityFlag[0xc] = false;
  this->_restrictedEntityFlag[0xd] = false;
  this->_restrictedEntityFlag[0xe] = false;
  this->_restrictedEntityFlag[0xf] = false;
  this->_restrictedEntityFlag[0x10] = false;
  this->_restrictedEntityFlag[0x11] = false;
  this->_restrictedEntityFlag[0x12] = false;
  this->_restrictedEntityFlag[0x13] = false;
  this->_restrictedEntityFlag[0x14] = false;
  this->_restrictedEntityFlag[0x15] = false;
  this->_restrictedEntityFlag[0x16] = false;
  this->_restrictedEntityFlag[0x17] = false;
  this->_restrictedEntityFlag[0x18] = false;
  this->_restrictedEntityFlag[0x19] = false;
  this->_restrictedEntityFlag[0x1a] = false;
  this->_restrictedEntityFlag[0x1b] = false;
  this->_restrictedEntityFlag[0x1c] = false;
  this->_restrictedEntityFlag[0x1d] = false;
  this->_restrictedEntityFlag[0x1e] = false;
  this->_restrictedEntityFlag[0x1f] = false;
  this->_restrictedEntityFlag[0x20] = false;
  this->_restrictedEntityFlag[0x21] = false;
  this->_restrictedEntityFlag[0x22] = false;
  this->_restrictedEntityFlag[0x23] = false;
  this->_restrictedEntityFlag[0x24] = false;
  this->_restrictedEntityFlag[0x25] = false;
  this->_restrictedEntityFlag[0x26] = false;
  this->_restrictedEntityFlag[0x27] = false;
  this->_restrictedEntityFlag[0x28] = false;
  this->_restrictedEntityFlag[0x29] = false;
  this->_restrictedEntityFlag[0x2a] = false;
  this->_restrictedEntityFlag[0x2b] = false;
  this->_restrictedEntityFlag[0x2c] = false;
  this->_restrictedEntityFlag[0x2d] = false;
  this->_restrictedEntityFlag[0x2e] = false;
  this->_restrictedEntityFlag[0x2f] = false;
  this->_restrictedEntityFlag[0x30] = false;
  this->_restrictedEntityFlag[0x31] = false;
  this->_restrictedEntityFlag[0x32] = false;
  this->_restrictedEntityFlag[0x33] = false;
  this->_restrictedEntityFlag[0x34] = false;
  this->_restrictedEntityFlag[0x35] = false;
  this->_restrictedEntityFlag[0x36] = false;
  this->_restrictedEntityFlag[0x37] = false;
  this->_restrictedEntityFlag[0x38] = false;
  this->_restrictedEntityFlag[0x39] = false;
  this->_restrictedEntityFlag[0x3a] = false;
  this->_restrictedEntityFlag[0x3b] = false;
  this->_restrictedEntityFlag[0x3c] = false;
  this->_restrictedEntityFlag[0x3d] = false;
  this->_restrictedEntityFlag[0x3e] = false;
  this->_restrictedEntityFlag[0x3f] = false;
  lVar2 = 0xc;
  do {
    this->_entityFlag[*(byte *)((long)&entities + lVar2)] = true;
    lVar2 = lVar2 + 0x10;
  } while (lVar2 != 0x5c);
  this->_restrictedEntityFlag[0x26] = true;
  this->_restrictedEntityFlag[0x3c] = true;
  this->_restrictedEntityFlag[0x3e] = true;
  DynArray<char,_20>::EnsureCapacity(&this->_buffer,1);
  (this->_buffer)._mem[(this->_buffer)._size] = '\0';
  piVar1 = &(this->_buffer)._size;
  *piVar1 = *piVar1 + 1;
  return;
}

Assistant:

XMLPrinter::XMLPrinter( FILE* file, bool compact, int depth ) :
    _elementJustOpened( false ),
    _firstElement( true ),
    _fp( file ),
    _depth( depth ),
    _textDepth( -1 ),
    _processEntities( true ),
    _compactMode( compact )
{
    for( int i=0; i<ENTITY_RANGE; ++i ) {
        _entityFlag[i] = false;
        _restrictedEntityFlag[i] = false;
    }
    for( int i=0; i<NUM_ENTITIES; ++i ) {
        const char entityValue = entities[i].value;
        TIXMLASSERT( ((unsigned char)entityValue) < ENTITY_RANGE );
        _entityFlag[ (unsigned char)entityValue ] = true;
    }
    _restrictedEntityFlag[(unsigned char)'&'] = true;
    _restrictedEntityFlag[(unsigned char)'<'] = true;
    _restrictedEntityFlag[(unsigned char)'>'] = true;	// not required, but consistency is nice
    _buffer.Push( 0 );
}